

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

bool __thiscall PPrototype::IsMatch(PPrototype *this,intptr_t id1,intptr_t id2)

{
  PType **ppPVar1;
  ulong uVar2;
  ulong uVar3;
  TArray<PType_*,_PType_*> *args;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = (ulong)*(uint *)(id1 + 0xc);
  if (*(uint *)(id1 + 0xc) == (this->ArgumentTypes).Count) {
    bVar5 = uVar3 == 0;
    if (!bVar5) {
      ppPVar1 = (this->ArgumentTypes).Array;
      if ((PType *)**(long **)id1 != *ppPVar1) {
        return false;
      }
      uVar2 = 1;
      do {
        uVar4 = uVar2;
        if (uVar3 == uVar4) break;
        uVar2 = uVar4 + 1;
      } while ((PType *)(*(long **)id1)[uVar4] == ppPVar1[uVar4]);
      bVar5 = uVar3 <= uVar4;
    }
    if ((bVar5) &&
       (uVar3 = (ulong)*(uint *)(id2 + 0xc), *(uint *)(id2 + 0xc) == (this->ReturnTypes).Count)) {
      if (uVar3 == 0) {
        return uVar3 == 0;
      }
      ppPVar1 = (this->ReturnTypes).Array;
      if ((PType *)**(long **)id2 == *ppPVar1) {
        uVar2 = 1;
        do {
          uVar4 = uVar2;
          if (uVar3 == uVar4) break;
          uVar2 = uVar4 + 1;
        } while ((PType *)(*(long **)id2)[uVar4] == ppPVar1[uVar4]);
        return uVar3 <= uVar4;
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const TArray<T> &other) const
	{
		if (Count != other.Count)
		{
			return false;
		}
		for (unsigned int i = 0; i < Count; ++i)
		{
			if (Array[i] != other.Array[i])
			{
				return false;
			}
		}
		return true;
	}